

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

int mcpl_buf_is_text(mcpl_buffer_t *buf)

{
  char cVar1;
  size_t sVar2;
  
  if (buf->size != 0) {
    sVar2 = 0;
    do {
      cVar1 = buf->buf[sVar2];
      if ((4 < (byte)(cVar1 - 9U)) && (-1 < cVar1 && 0x5e < (byte)(cVar1 - 0x20U))) {
        return 0;
      }
      sVar2 = sVar2 + 1;
    } while (buf->size != sVar2);
  }
  return 1;
}

Assistant:

MCPL_LOCAL int mcpl_buf_is_text( mcpl_buffer_t* buf ) {
  //We correctly allow ASCII & UTF-8 but not UTF-16 and UTF-32 (by design).
  const unsigned char * it = (unsigned char*)buf->buf;
  const unsigned char * itE = it + buf->size;
  for (; it!=itE; ++it)
    if ( ! ( ( *it >=9 && *it<=13 ) || ( *it >=32 && *it<=126 ) || *it >=128 ) )
      return 0;
  return 1;
}